

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::LogBuilder::convertToColoredOutput(LogBuilder *this,string_t *logLine,Level level)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (base::utils::s_termSupportsColor != '\x01') {
    return;
  }
  if (level != Fatal) {
    if (level == Warning) {
      std::operator+(&local_50,"\x1b[33m",logLine);
      std::operator+(&local_30,&local_50,"\x1b[0m");
      goto LAB_00125a84;
    }
    if (level != Error) {
      return;
    }
  }
  std::operator+(&local_50,"\x1b[31m",logLine);
  std::operator+(&local_30,&local_50,"\x1b[0m");
LAB_00125a84:
  std::__cxx11::string::operator=((string *)logLine,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void convertToColoredOutput(base::type::string_t* logLine, Level level) {
        if (!base::utils::s_termSupportsColor) return;
        const base::type::char_t* resetColor = ELPP_LITERAL("\x1b[0m");
        if (level == Level::Error || level == Level::Fatal)
            *logLine = ELPP_LITERAL("\x1b[31m") + *logLine + resetColor;
        else if (level == Level::Warning)
            *logLine = ELPP_LITERAL("\x1b[33m") + *logLine + resetColor;
    }